

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O3

CommandOptions * write_aux_data_file(CommandOptions *Options)

{
  Result_t *this;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AESEncContext *this_00;
  HMACContext *this_01;
  long lVar8;
  _IO_FILE *extraout_RDX;
  CommandOptions *in_RSI;
  MyInfo *pMVar9;
  undefined8 *puVar10;
  uint uVar11;
  byte bVar12;
  FortunaRNG RNG;
  SequenceParser Parser;
  MXFWriter Writer;
  WriterInfo Info;
  DCDataDescriptor DDesc;
  FrameBuffer FrameBuffer;
  byte_t IV_buf [16];
  FortunaRNG local_249;
  HMACContext *local_248;
  AESEncContext *local_240;
  SequenceParser local_238 [16];
  undefined1 local_228 [81];
  bool bStack_1d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  long local_180 [2];
  LabelSet_t local_170;
  UUID local_168 [3];
  Rational local_100 [3];
  undefined8 local_e4;
  undefined8 uStack_dc;
  undefined1 local_d0 [56];
  DCDataDescriptor local_98 [2];
  
  bVar12 = 0;
  ASDCP::DCData::MXFWriter::MXFWriter((MXFWriter *)local_228);
  ASDCP::DCData::FrameBuffer::FrameBuffer((FrameBuffer *)local_d0,in_RSI->fb_size);
  local_100[0].Numerator = 0;
  local_100[0].Denominator = 0;
  ASDCP::DCData::SequenceParser::SequenceParser(local_238);
  ASDCP::DCData::SequenceParser::OpenRead((string *)Options);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->asset_id_flag;
  iVar1._3_1_ = Options->encrypt_header_flag;
  if (iVar1 < 0) goto LAB_0010e693;
  ASDCP::DCData::SequenceParser::FillDCDataDescriptor((DCDataDescriptor *)(local_d0 + 0x38));
  Kumu::Result_t::~Result_t((Result_t *)(local_d0 + 0x38));
  local_e4 = *(undefined8 *)(in_RSI->aux_data_coding).super_Identifier<16U>.m_Value;
  uStack_dc = *(undefined8 *)((in_RSI->aux_data_coding).super_Identifier<16U>.m_Value + 8);
  local_100[0] = CommandOptions::PictureRate(in_RSI);
  if (in_RSI->verbose_flag == true) {
    fwrite("Aux Data\n",9,1,_stderr);
    fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
    ASDCP::DCData::DCDataDescriptorDump((DCData *)local_100,(DCDataDescriptor *)0x0,extraout_RDX);
  }
  iVar2._0_1_ = Options->error_flag;
  iVar2._1_1_ = Options->key_flag;
  iVar2._2_1_ = Options->asset_id_flag;
  iVar2._3_1_ = Options->encrypt_header_flag;
  if (iVar2 < 0) goto LAB_0010e693;
  if (in_RSI->no_write_flag == false) {
    pMVar9 = &s_MyInfo;
    puVar10 = (undefined8 *)(local_228 + 0x10);
    for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar10 = *(undefined8 *)(pMVar9->super_WriterInfo).ProductUUID;
      pMVar9 = (MyInfo *)((long)pMVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
    }
    local_228[0x50] = s_MyInfo.super_WriterInfo.EncryptedEssence;
    bStack_1d7 = s_MyInfo.super_WriterInfo.UsesHMAC;
    local_1d0._M_allocated_capacity = (size_type)local_1c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
    local_1b0._M_allocated_capacity = (size_type)local_1a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
    local_190._M_allocated_capacity = (size_type)local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductName._M_string_length);
    local_170 = s_MyInfo.super_WriterInfo.LabelSetType;
    if (in_RSI->asset_id_flag == true) {
      local_228._32_8_ = *(undefined8 *)in_RSI->asset_id_value;
      local_228._40_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
    }
    else {
      Kumu::GenRandomUUID(local_228 + 0x20);
    }
    local_170 = 2;
    if (in_RSI->key_flag == true) {
      Kumu::FortunaRNG::FortunaRNG(&local_249);
      Kumu::GenRandomUUID(local_228 + 0x30);
      local_228[0x50] = true;
      if (in_RSI->key_id_flag == true) {
        local_228._64_4_ = *(undefined4 *)in_RSI->key_id_value;
        local_228._68_4_ = *(undefined4 *)(in_RSI->key_id_value + 4);
        local_228._72_4_ = *(undefined4 *)(in_RSI->key_id_value + 8);
        local_228._76_4_ = *(undefined4 *)(in_RSI->key_id_value + 0xc);
      }
      else {
        local_168[0].super_Identifier<16U>.m_HasValue = false;
        local_168[0].super_Identifier<16U>.m_Value[0] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[1] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[2] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[3] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[4] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[5] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[6] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[7] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[8] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[9] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[10] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[0xb] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[0xc] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[0xd] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[0xe] = '\0';
        local_168[0].super_Identifier<16U>.m_Value[0xf] = '\0';
        local_168[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
             (_func_int **)&PTR__IArchive_00115b98;
        Kumu::GenRandomValue(local_168);
        local_228._64_4_ = local_168[0].super_Identifier<16U>.m_Value._0_4_;
        local_228._68_4_ = local_168[0].super_Identifier<16U>.m_Value._4_4_;
        local_228._72_4_ = local_168[0].super_Identifier<16U>.m_Value._8_4_;
        local_228._76_4_ = local_168[0].super_Identifier<16U>.m_Value._12_4_;
      }
      this_00 = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this_00);
      local_240 = this_00;
      ASDCP::AESEncContext::InitKey((uchar *)local_168);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_168);
      Kumu::Result_t::~Result_t((Result_t *)local_168);
      iVar3._0_1_ = Options->error_flag;
      iVar3._1_1_ = Options->key_flag;
      iVar3._2_1_ = Options->asset_id_flag;
      iVar3._3_1_ = Options->encrypt_header_flag;
      if (iVar3 < 0) {
LAB_0010e490:
        local_248 = (HMACContext *)0x0;
      }
      else {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_249,(int)local_d0 + 0x28);
        ASDCP::AESEncContext::SetIVec((uchar *)local_168);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_168);
        Kumu::Result_t::~Result_t((Result_t *)local_168);
        iVar4._0_1_ = Options->error_flag;
        iVar4._1_1_ = Options->key_flag;
        iVar4._2_1_ = Options->asset_id_flag;
        iVar4._3_1_ = Options->encrypt_header_flag;
        if ((iVar4 < 0) || (in_RSI->write_hmac != true)) goto LAB_0010e490;
        bStack_1d7 = true;
        this_01 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_01);
        local_248 = this_01;
        ASDCP::HMACContext::InitKey((uchar *)local_168,(LabelSet_t)this_01);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_168);
        Kumu::Result_t::~Result_t((Result_t *)local_168);
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_249);
    }
    else {
      local_248 = (HMACContext *)0x0;
      local_240 = (AESEncContext *)0x0;
    }
    iVar5._0_1_ = Options->error_flag;
    iVar5._1_1_ = Options->key_flag;
    iVar5._2_1_ = Options->asset_id_flag;
    iVar5._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar5) {
      ASDCP::DCData::MXFWriter::OpenWrite
                ((string *)local_168,(WriterInfo *)local_228,(DCDataDescriptor *)&in_RSI->out_file,
                 (int)local_228 + 0x10);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_168);
      Kumu::Result_t::~Result_t((Result_t *)local_168);
    }
    if ((long *)local_190._M_allocated_capacity != local_180) {
      operator_delete((void *)local_190._M_allocated_capacity,local_180[0] + 1);
    }
    if ((_Alloc_hider *)local_1b0._M_allocated_capacity != local_1a0) {
      operator_delete((void *)local_1b0._M_allocated_capacity,(ulong)(local_1a0[0]._M_p + 1));
    }
    if ((_Alloc_hider *)local_1d0._M_allocated_capacity != local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,(ulong)(local_1c0[0]._M_p + 1));
    }
    iVar6._0_1_ = Options->error_flag;
    iVar6._1_1_ = Options->key_flag;
    iVar6._2_1_ = Options->asset_id_flag;
    iVar6._3_1_ = Options->encrypt_header_flag;
    if (iVar6 < 0) goto LAB_0010e693;
  }
  else {
    local_240 = (AESEncContext *)0x0;
    local_248 = (HMACContext *)0x0;
  }
  ASDCP::DCData::SequenceParser::Reset();
  Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_228 + 0x10));
  Kumu::Result_t::~Result_t((Result_t *)(local_228 + 0x10));
  iVar7._0_1_ = Options->error_flag;
  iVar7._1_1_ = Options->key_flag;
  iVar7._2_1_ = Options->asset_id_flag;
  iVar7._3_1_ = Options->encrypt_header_flag;
  if ((-1 < iVar7) && (in_RSI->duration != 0)) {
    uVar11 = 0;
    this = (Result_t *)(local_228 + 0x10);
    while( true ) {
      ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)this);
      Kumu::Result_t::operator=((Result_t *)Options,this);
      Kumu::Result_t::~Result_t(this);
      iVar7._0_1_ = Options->error_flag;
      iVar7._1_1_ = Options->key_flag;
      iVar7._2_1_ = Options->asset_id_flag;
      iVar7._3_1_ = Options->encrypt_header_flag;
      if (iVar7 < 0) break;
      if (in_RSI->verbose_flag == true) {
        ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)local_d0,(uint)_stderr);
      }
      if (in_RSI->encrypt_header_flag == true) {
        local_d0._36_4_ = 0;
      }
      iVar7._0_1_ = Options->error_flag;
      iVar7._1_1_ = Options->key_flag;
      iVar7._2_1_ = Options->asset_id_flag;
      iVar7._3_1_ = Options->encrypt_header_flag;
      if (iVar7 < 0) break;
      if (in_RSI->no_write_flag == false) {
        ASDCP::DCData::MXFWriter::WriteFrame
                  ((FrameBuffer *)this,(AESEncContext *)local_228,(HMACContext *)local_d0);
        Kumu::Result_t::operator=((Result_t *)Options,this);
        Kumu::Result_t::~Result_t(this);
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->asset_id_flag;
        iVar7._3_1_ = Options->encrypt_header_flag;
      }
      if ((iVar7 < 0) || (uVar11 = uVar11 + 1, in_RSI->duration <= uVar11)) break;
    }
  }
  if (iVar7 == Kumu::RESULT_ENDOFFILE) {
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
    iVar7._0_1_ = Options->error_flag;
    iVar7._1_1_ = Options->key_flag;
    iVar7._2_1_ = Options->asset_id_flag;
    iVar7._3_1_ = Options->encrypt_header_flag;
  }
  if ((-1 < iVar7) && (in_RSI->no_write_flag == false)) {
    ASDCP::DCData::MXFWriter::Finalize();
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_228 + 0x10));
    Kumu::Result_t::~Result_t((Result_t *)(local_228 + 0x10));
  }
LAB_0010e693:
  ASDCP::DCData::SequenceParser::~SequenceParser(local_238);
  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)local_d0);
  ASDCP::DCData::MXFWriter::~MXFWriter((MXFWriter *)local_228);
  return Options;
}

Assistant:

Result_t
write_aux_data_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  DCData::MXFWriter       Writer;
  DCData::FrameBuffer     FrameBuffer(Options.fb_size);
  DCData::DCDataDescriptor DDesc;
  DCData::SequenceParser  Parser;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
  {
    Parser.FillDCDataDescriptor(DDesc);
    memcpy(DDesc.DataEssenceCoding, Options.aux_data_coding.Value(), Options.aux_data_coding.Size());
    DDesc.EditRate = Options.PictureRate();

    if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Aux Data\n");
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  DCData::DCDataDescriptorDump(DDesc);
	}
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif // HAVE_OPENSSL

    if ( ASDCP_SUCCESS(result) )
      result = Writer.OpenWrite(Options.out_file, Info, DDesc);
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t duration = 0;
    result = Parser.Reset();

    while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
      result = Parser.ReadFrame(FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
      {
        if ( Options.verbose_flag )
          FrameBuffer.Dump(stderr, Options.fb_dump_size);

        if ( Options.encrypt_header_flag )
          FrameBuffer.PlaintextOffset(0);
      }

      if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
      {
        result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

        // The Writer class will forward the last block of ciphertext
        // to the encryption context for use as the IV for the next
        // frame. If you want to use non-sequitur IV values, un-comment
        // the following  line of code.
        // if ( ASDCP_SUCCESS(result) && Options.key_flag )
        //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
      }
	}

    if ( result == RESULT_ENDOFFILE )
      result = RESULT_OK;
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}